

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgn_scanner.c
# Opt level: O2

void yypop_buffer_state(void)

{
  YY_BUFFER_STATE *ppyVar1;
  size_t sVar2;
  
  if ((yy_buffer_stack != (YY_BUFFER_STATE *)0x0) &&
     (yy_buffer_stack[yy_buffer_stack_top] != (YY_BUFFER_STATE)0x0)) {
    yy_delete_buffer(yy_buffer_stack[yy_buffer_stack_top]);
    sVar2 = yy_buffer_stack_top;
    ppyVar1 = yy_buffer_stack;
    yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    if ((sVar2 != 0) &&
       (yy_buffer_stack_top = sVar2 - 1, ppyVar1[sVar2 - 1] != (YY_BUFFER_STATE)0x0)) {
      yy_load_buffer_state();
      yy_did_buffer_switch_on_eof = 1;
    }
  }
  return;
}

Assistant:

void yypop_buffer_state (void)
{
    	if (!YY_CURRENT_BUFFER)
		return;

	yy_delete_buffer(YY_CURRENT_BUFFER );
	YY_CURRENT_BUFFER_LVALUE = NULL;
	if ((yy_buffer_stack_top) > 0)
		--(yy_buffer_stack_top);

	if (YY_CURRENT_BUFFER) {
		yy_load_buffer_state(  );
		(yy_did_buffer_switch_on_eof) = 1;
	}
}